

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twosided_exponential_dist.hpp
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  long lVar2;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  istream *in_00;
  long lVar4;
  double mu;
  delim_c local_22;
  delim_c local_21;
  result_type_conflict2 local_20;
  
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_21.c = '(';
  pbVar3 = utility::operator>>(in,&local_21);
  in_00 = std::istream::_M_extract<double>((double *)pbVar3);
  local_22.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_00,&local_22);
  lVar2 = *(long *)in;
  lVar4 = *(long *)(lVar2 + -0x18);
  if (((byte)in[lVar4 + 0x20] & 5) == 0) {
    P->mu_ = local_20;
    lVar4 = *(long *)(lVar2 + -0x18);
  }
  *(undefined4 *)(in + lVar4 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t mu;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> mu >> utility::delim(')');
        if (in)
          P = param_type(mu);
        in.flags(flags);
        return in;
      }